

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  int in_EDI;
  WebServer webServer;
  int blockTime;
  int maxTask;
  int threadNum;
  int port;
  char *ip;
  WebServer *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  WebServer *in_stack_ffffffffffffffb0;
  int local_4;
  
  if (in_EDI < 7) {
    poVar1 = std::operator<<((ostream *)&std::cout,"usage:");
    poVar1 = std::operator<<(poVar1,(char *)*in_RSI);
    poVar1 = std::operator<<(poVar1,
                             " ip_address port_number thread_number maxTask_number waitTime flag_run_in_backstage(1"
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    if (*(char *)in_RSI[6] == '1') {
      daemonize();
    }
    atoi((char *)in_RSI[2]);
    atoi((char *)in_RSI[3]);
    atoi((char *)in_RSI[4]);
    atoi((char *)in_RSI[5]);
    WebServer::WebServer
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    WebServer::run((WebServer *)webServer.serverSocket_._0_8_);
    poVar1 = std::operator<<((ostream *)&std::cout,"WebServer over!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    WebServer::~WebServer(in_stack_ffffffffffffff90);
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
    // test();

    if (argc < 7)
    {
        std::cout << "usage:" << argv[0] << " ip_address port_number thread_number maxTask_number waitTime flag_run_in_backstage(1\0)" << std::endl;
        return 1;
    }

    if (argv[6][0] == '1')
    {
        daemonize();
    }
    char *ip = argv[1];
    int port = atoi(argv[2]), threadNum = atoi(argv[3]), maxTask = atoi(argv[4]), blockTime = atoi(argv[5]);
    WebServer webServer(ip, port, threadNum, maxTask, blockTime);
    webServer.run();
    std::cout << "WebServer over!" << std::endl;
    return 0;
}